

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

void Gia_QbfAddSpecialConstr(Qbf_Man_t *p)

{
  int iVar1;
  int local_20;
  lit lStack_1c;
  int Lits [2];
  int status;
  int i;
  Qbf_Man_t *p_local;
  
  Lits[1] = 0;
  do {
    if (0x2b < Lits[1]) {
      return;
    }
    if (Lits[1] % 4 == 0) {
      iVar1 = Vec_IntEntry(p->vParMap,Lits[1]);
      if (iVar1 != -1) {
        __assert_fail("Vec_IntEntry(p->vParMap, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaQbf.c"
                      ,0x24e,"void Gia_QbfAddSpecialConstr(Qbf_Man_t *)");
      }
      Vec_IntWriteEntry(p->vParMap,Lits[1],(uint)(Lits[1] % 4 == 3));
      local_20 = Abc_Var2Lit(Lits[1],(uint)(Lits[1] % 4 != 3));
      Lits[0] = sat_solver_addclause(p->pSatSyn,&local_20,&lStack_1c);
      if (Lits[0] == 0) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaQbf.c"
                      ,0x252,"void Gia_QbfAddSpecialConstr(Qbf_Man_t *)");
      }
    }
    Lits[1] = Lits[1] + 1;
  } while( true );
}

Assistant:

void Gia_QbfAddSpecialConstr( Qbf_Man_t * p )
{
    int i, status, Lits[2];
    for ( i = 0; i < 4*11; i++ )
        if ( i % 4 == 0 )
        {
            assert( Vec_IntEntry(p->vParMap, i) == -1 );
            Vec_IntWriteEntry( p->vParMap, i, (i % 4) == 3 );
            Lits[0] = Abc_Var2Lit( i, (i % 4) != 3 );
            status = sat_solver_addclause( p->pSatSyn, Lits, Lits+1 );
            assert( status );
        }
}